

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

uint32 __thiscall TTD::TTEventList::Count(TTEventList *this)

{
  uint32 uVar1;
  TTEventListLink *pTVar2;
  size_t sVar3;
  
  pTVar2 = this->m_headBlock;
  if (pTVar2 != (TTEventListLink *)0x0) {
    uVar1 = 0;
    do {
      sVar3 = pTVar2->StartPos;
      if (sVar3 != pTVar2->CurrPos) {
        do {
          uVar1 = uVar1 + 1;
          sVar3 = sVar3 + this->m_vtable[*(uint *)(pTVar2->BlockData + sVar3)].DataSize;
        } while (sVar3 != pTVar2->CurrPos);
      }
      pTVar2 = pTVar2->Previous;
    } while (pTVar2 != (TTEventListLink *)0x0);
    return uVar1;
  }
  return 0;
}

Assistant:

uint32 TTEventList::Count() const
    {
        uint32 count = 0;

        for(TTEventListLink* curr = this->m_headBlock; curr != nullptr; curr = curr->Previous)
        {
            size_t cpos = curr->StartPos;
            while(cpos != curr->CurrPos)
            {
                count++;

                NSLogEvents::EventLogEntry* data = reinterpret_cast<NSLogEvents::EventLogEntry*>(curr->BlockData + cpos);
                cpos += this->m_vtable[(uint32)data->EventKind].DataSize;
            }
        }

        return count;
    }